

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

char encode(char input)

{
  char cVar1;
  char cVar2;
  int iVar3;
  bool bVar4;
  
  if ((byte)(input + 0xbfU) < 0x1a) {
    cVar1 = ' ';
    if (input != 'E') {
      if ((input & 1U) == 0) {
        bVar4 = (byte)input < 0x57;
        cVar1 = '\x04';
        cVar2 = -0x16;
      }
      else {
        bVar4 = (byte)input < 0x55;
        cVar1 = '\x06';
        cVar2 = -0x14;
      }
      if (bVar4) {
        cVar2 = cVar1;
      }
      return cVar2 + input;
    }
  }
  else {
    cVar1 = '-';
    if (input == ' ') {
      iVar3 = rand();
      cVar1 = (char)(iVar3 % 10) + '0';
    }
  }
  return cVar1;
}

Assistant:

char encode(const char input) {
  if (input >= 'A' && input <= 'Z') {
    if (input == 'E') return ' ';
    if (input % 2) {
      return input + 6 <= 'Z' ? input + 6 : input - 20;
    } else {
      return input + 4 <= 'Z' ? input + 4 : input - 22;
    }
  }
  if (input == ' ') return '0' + (char)(rand() % 10);
  else return '-';
}